

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O1

UINT8 device_start_rf5c68_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT8 UVar2;
  DEV_DATA DVar3;
  void *pvVar4;
  long lVar5;
  rf5c68_state *chip;
  
  uVar1 = cfg->clock;
  DVar3.chipInf = calloc(1,0xa8);
  if (DVar3.chipInf == (void *)0x0) {
    DVar3.chipInf = (void *)0x0;
  }
  else {
    *(undefined4 *)((long)DVar3.chipInf + 0x8c) = 0x10000;
    pvVar4 = malloc(0x10000);
    *(void **)((long)DVar3.chipInf + 0x90) = pvVar4;
    *(undefined8 *)((long)DVar3.chipInf + 0x98) = 0;
    *(undefined8 *)((long)DVar3.chipInf + 0xa0) = 0;
    lVar5 = 0x14;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x94);
  }
  if (DVar3.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar1 / 0x180;
    retDevInf->devDef = &devDef_RF5C68_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_rf5c68_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 384;
	chip = device_start_rf5c68(cfg->clock);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_RF5C68_MAME);
	return 0x00;
}